

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

size_t zt_hex_to_binary(char *hex,size_t hlen,void *data,size_t dlen)

{
  char cVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  uint8_t c;
  byte bVar5;
  byte bVar6;
  
  uVar2 = 0;
  if (hlen != 0) {
    uVar2 = 0;
    uVar4 = 0;
    do {
      cVar1 = hex[uVar4];
      if (cVar1 == '\0') {
        return uVar2;
      }
      if ((-(ulong)(data == (void *)0x0) | dlen) <= uVar2) {
        return uVar2;
      }
      bVar5 = cVar1 - 0x30;
      if (9 < bVar5) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar5 = cVar1 - 0x37;
        }
        else {
          if ((byte)(cVar1 + 0x99U) < 0xfa) {
            piVar3 = __errno_location();
            *piVar3 = 0x16;
            return 0;
          }
          bVar5 = cVar1 + 0xa9;
        }
      }
      cVar1 = hex[uVar4 + 1];
      bVar6 = cVar1 - 0x30;
      if (9 < bVar6) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar6 = cVar1 - 0x37;
        }
        else {
          if ((byte)(cVar1 + 0x99U) < 0xfa) {
            return 0;
          }
          bVar6 = cVar1 + 0xa9;
        }
      }
      if (data != (void *)0x0) {
        *(byte *)((long)data + uVar2) = bVar5 << 4 | bVar6 & 0xf;
      }
      uVar2 = uVar2 + 1;
      uVar4 = uVar4 + 2;
    } while (uVar4 < hlen);
  }
  return uVar2;
}

Assistant:

size_t
zt_hex_to_binary(char *hex, size_t hlen, void *data, size_t dlen) {
    size_t n;
    size_t y = 0;

    if (data == NULL) {
        dlen = -1;
    }

    for (n = 0, y = 0; n < hlen && *hex != '\0' && y < dlen; n++) {
        int8_t c;
        int8_t c2;
        int8_t cc = 0;

        if ((c = hex_to_char(*hex++)) == -1) {
            errno = EINVAL;
            return 0;
        }

        if ((c2 = hex_to_char(*hex++)) == -1) {
            return 0;
        } else {
            n++;
        }

        cc = (c << 4) | (c2 & 0xF);

        if (data != NULL) {
            ((char *)data)[y] = (char)cc;
        }
        y++;
    }
    return y;
}